

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

int __thiscall pstore::file::file_handle::truncate(file_handle *this,char *__file,__off_t __length)

{
  int iVar1;
  int *piVar2;
  string local_40;
  int local_1c;
  char *pcStack_18;
  int err;
  uint64_t size_local;
  file_handle *this_local;
  
  pcStack_18 = __file;
  size_local = (uint64_t)this;
  ensure_open(this);
  if ((char *)0x7fffffffffffffff < pcStack_18) {
    raise<std::errc,char[9]>(invalid_argument,(char (*) [9])"truncate");
  }
  iVar1 = ftruncate(this->file_,(__off_t)pcStack_18);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    local_1c = iVar1;
    path_abi_cxx11_(&local_40,this);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (iVar1,"ftruncate failed",&local_40);
  }
  return iVar1;
}

Assistant:

void file_handle::truncate (std::uint64_t const size) {
            this->ensure_open ();
            if (size > uoff_max) {
                raise (std::errc::invalid_argument, "truncate");
            }
            if (::ftruncate (file_, static_cast<off_t> (size)) == -1) {
                int const err = errno;
                raise_file_error (err, "ftruncate failed", this->path ());
            }
        }